

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClear
          (MessageGenerator *this,Printer *printer)

{
  FieldDescriptor *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  Type TVar6;
  LogMessage *pLVar7;
  FieldGenerator *pFVar8;
  long *plVar9;
  pointer ppFVar10;
  Descriptor *pDVar11;
  uint uVar12;
  pointer ppFVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  uint extraout_EDX;
  uint i;
  FieldDescriptor *field;
  ulong uVar17;
  FieldDescriptor *pFVar18;
  FieldDescriptor *field_00;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  int iVar24;
  string first_field_name;
  string last_field_name;
  uint local_c0;
  uint local_a4;
  undefined1 local_a0 [60];
  uint local_64;
  string local_60;
  FieldGeneratorMap *local_40;
  uint local_38;
  uint local_34;
  
  io::Printer::Print(printer,
                     "void $classname$::Clear() {\n// @@protoc_insertion_point(message_clear_start:$full_name$)\n"
                     ,"classname",&this->classname_,"full_name",*(string **)(this->descriptor_ + 8))
  ;
  io::Printer::Indent(printer);
  if (0 < *(int *)(this->descriptor_ + 0x68)) {
    io::Printer::Print(printer,"_extensions_.Clear();\n");
  }
  ppFVar10 = (this->optimized_order_).
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppFVar13 = (this->optimized_order_).
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar13 != ppFVar10) {
    local_40 = &this->field_generators_;
    uVar16 = 0;
    uVar5 = 0xffffffff;
    do {
      if (uVar16 == uVar5) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0xa49);
        pLVar7 = internal::LogMessage::operator<<
                           ((LogMessage *)local_a0,"CHECK failed: (i) != (last_i): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_60,pLVar7);
        internal::LogMessage::~LogMessage((LogMessage *)local_a0);
        ppFVar10 = (this->optimized_order_).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppFVar13 = (this->optimized_order_).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar19 = (ulong)(int)uVar16;
      uVar14 = (long)ppFVar13 - (long)ppFVar10 >> 3;
      uVar5 = uVar16;
      if (uVar19 < uVar14) {
        do {
          pFVar18 = ppFVar10[uVar19];
          pFVar8 = FieldGeneratorMap::get(local_40,pFVar18);
          if (*(int *)(pFVar18 + 0x4c) != 3) {
            ppFVar10 = (this->optimized_order_).
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            uVar14 = (long)(this->optimized_order_).
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar10 >> 3;
            break;
          }
          if ((this->use_dependent_base_ == true) && (bVar4 = IsFieldDependent(pFVar18), bVar4)) {
            FieldName_abi_cxx11_((string *)local_a0,(cpp *)pFVar18,field);
            io::Printer::Print(printer,"clear_$name$();\n","name",(string *)local_a0);
            if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
              operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
            }
          }
          else {
            (*pFVar8->_vptr_FieldGenerator[10])(pFVar8,printer);
          }
          uVar19 = uVar19 + 1;
          ppFVar10 = (this->optimized_order_).
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          uVar14 = (long)(this->optimized_order_).
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar10 >> 3;
        } while (uVar19 < uVar14);
        uVar5 = (uint)uVar19;
        uVar19 = (ulong)(int)uVar5;
      }
      local_34 = uVar16;
      if (uVar19 < uVar14) {
        pFVar18 = ppFVar10[uVar19];
        bVar4 = anon_unknown_0::CanInitializeByZeroing(pFVar18);
        if (bVar4) {
          uVar22 = 0;
          uVar17 = 0xffffffff;
          local_a4 = 0xffffffff;
          local_c0 = 0xffffffff;
          iVar24 = -1;
          uVar20 = uVar19;
          uVar14 = uVar19;
          do {
            uVar14 = uVar14 + 1;
            uVar19 = uVar20 & 0xffffffff;
            uVar5 = 0;
            if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) {
              if (pFVar18[0x50] == (FieldDescriptor)0x0) {
                plVar9 = (long *)(*(long *)(pFVar18 + 0x58) + 0x30);
              }
              else if (*(long *)(pFVar18 + 0x68) == 0) {
                plVar9 = (long *)(*(long *)(pFVar18 + 0x30) + 0x98);
              }
              else {
                plVar9 = (long *)(*(long *)(pFVar18 + 0x68) + 0x80);
              }
              uVar5 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                      .super__Vector_impl_data._M_start
                      [(int)((ulong)((long)pFVar18 - *plVar9) >> 3) * 0x3cf3cf3d];
            }
            uVar16 = uVar5 + 7;
            if (-1 < (int)uVar5) {
              uVar16 = uVar5;
            }
            uVar15 = (uint)uVar20;
            uVar12 = uVar15;
            iVar3 = (int)uVar16 >> 3;
            if ((iVar24 != -1) && (uVar12 = local_c0, iVar3 = iVar24, (int)uVar16 >> 3 != iVar24)) {
              uVar15 = (uint)uVar17;
              break;
            }
            iVar24 = iVar3;
            local_c0 = uVar12;
            if (local_a4 == 0xffffffff) {
              local_a4 = uVar15;
            }
            uVar22 = uVar22 | 1 << (uVar5 & 0x1f);
            ppFVar13 = (this->optimized_order_).
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(this->optimized_order_).
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar13 >> 3) <=
                uVar14) {
              uVar19 = (ulong)(uVar15 + 1);
              break;
            }
            pFVar18 = ppFVar13[uVar14];
            bVar4 = anon_unknown_0::CanInitializeByZeroing(pFVar18);
            uVar19 = (ulong)(uVar15 + 1);
            uVar17 = uVar20 & 0xffffffff;
            uVar20 = uVar19;
          } while (bVar4);
        }
        else {
          uVar22 = 0;
          uVar15 = 0xffffffff;
          local_a4 = 0xffffffff;
          local_c0 = 0xffffffff;
          iVar24 = -1;
        }
        uVar5 = (uint)uVar19;
        ppFVar10 = (this->optimized_order_).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        uVar19 = (ulong)(int)uVar5;
        uVar14 = (long)(this->optimized_order_).
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar10 >> 3;
      }
      else {
        uVar22 = 0;
        uVar15 = 0xffffffff;
        local_a4 = 0xffffffff;
        local_c0 = 0xffffffff;
        iVar24 = -1;
      }
      local_38 = uVar15;
      if (uVar19 < uVar14) {
        do {
          pFVar18 = ppFVar10[uVar19];
          uVar5 = (uint)uVar19;
          if ((*(int *)(pFVar18 + 0x4c) == 3) ||
             (bVar4 = anon_unknown_0::CanInitializeByZeroing(pFVar18), bVar4)) goto LAB_0025733d;
          uVar16 = 0;
          if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) {
            if (pFVar18[0x50] == (FieldDescriptor)0x0) {
              plVar9 = (long *)(*(long *)(pFVar18 + 0x58) + 0x30);
            }
            else if (*(long *)(pFVar18 + 0x68) == 0) {
              plVar9 = (long *)(*(long *)(pFVar18 + 0x30) + 0x98);
            }
            else {
              plVar9 = (long *)(*(long *)(pFVar18 + 0x68) + 0x80);
            }
            uVar16 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start
                     [(int)((ulong)((long)pFVar18 - *plVar9) >> 3) * 0x3cf3cf3d];
          }
          uVar12 = uVar16 + 7;
          if (-1 < (int)uVar16) {
            uVar12 = uVar16;
          }
          uVar2 = uVar5;
          iVar3 = (int)uVar12 >> 3;
          if ((iVar24 != -1) && (uVar2 = local_c0, iVar3 = iVar24, (int)uVar12 >> 3 != iVar24))
          goto LAB_00257347;
          iVar24 = iVar3;
          local_c0 = uVar2;
          uVar22 = uVar22 | 1 << (uVar16 & 0x1f);
          uVar19 = uVar19 + 1;
          ppFVar10 = (this->optimized_order_).
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          uVar15 = uVar5;
        } while (uVar19 < (ulong)((long)(this->optimized_order_).
                                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar10
                                 >> 3));
        uVar5 = (uint)uVar19;
      }
LAB_0025733d:
      uVar16 = uVar5;
      if (iVar24 != -1) {
LAB_00257347:
        local_64 = uVar5;
        if (local_c0 == 0xffffffff) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0xa9e);
          pLVar7 = internal::LogMessage::operator<<
                             ((LogMessage *)local_a0,"CHECK failed: (-1) != (last_chunk_start): ");
          internal::LogFinisher::operator=((LogFinisher *)&local_60,pLVar7);
          internal::LogMessage::~LogMessage((LogMessage *)local_a0);
        }
        if (uVar15 == 0xffffffff) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0xa9f);
          pLVar7 = internal::LogMessage::operator<<
                             ((LogMessage *)local_a0,"CHECK failed: (-1) != (last_chunk_end): ");
          internal::LogFinisher::operator=((LogFinisher *)&local_60,pLVar7);
          internal::LogMessage::~LogMessage((LogMessage *)local_a0);
        }
        if (uVar22 == 0) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0xaa0);
          pLVar7 = internal::LogMessage::operator<<
                             ((LogMessage *)local_a0,"CHECK failed: (0) != (last_chunk_mask): ");
          internal::LogFinisher::operator=((LogFinisher *)&local_60,pLVar7);
          internal::LogMessage::~LogMessage((LogMessage *)local_a0);
          uVar5 = 0;
        }
        else {
          uVar5 = 0;
          uVar14 = (ulong)uVar22;
          do {
            uVar16 = (uint)uVar14;
            uVar5 = uVar5 + (uVar16 & 1);
            uVar14 = uVar14 >> 1;
          } while (1 < uVar16);
        }
        bVar4 = *(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3;
        if (local_c0 != uVar15 && bVar4) {
          if ((int)uVar5 < 2) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0xaaa);
            pLVar7 = internal::LogMessage::operator<<
                               ((LogMessage *)local_a0,"CHECK failed: (2) <= (count): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_60,pLVar7);
LAB_002574eb:
            internal::LogMessage::~LogMessage((LogMessage *)local_a0);
            uVar16 = extraout_EDX;
          }
          else {
            uVar16 = local_c0;
            if (8 < uVar5) {
              internal::LogMessage::LogMessage
                        ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                         ,0xaab);
              pLVar7 = internal::LogMessage::operator<<
                                 ((LogMessage *)local_a0,"CHECK failed: (8) >= (count): ");
              internal::LogFinisher::operator=((LogFinisher *)&local_60,pLVar7);
              goto LAB_002574eb;
            }
          }
          SimpleItoa_abi_cxx11_((string *)local_a0,(protobuf *)(ulong)(uint)(iVar24 << 3),uVar16);
          SimpleItoa_abi_cxx11_(&local_60,(protobuf *)(ulong)uVar22,i);
          io::Printer::Print(printer,"if (_has_bits_[$index$ / 32] & $mask$u) {\n","index",
                             (string *)local_a0,"mask",&local_60);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
            operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
          }
          io::Printer::Indent(printer);
        }
        uVar5 = local_38;
        pFVar18 = (FieldDescriptor *)(ulong)local_c0;
        if (local_a4 != 0xffffffff) {
          if (local_a4 == local_38) {
            pFVar8 = FieldGeneratorMap::get
                               (local_40,(this->optimized_order_).
                                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start[(int)local_38]);
            (*pFVar8->_vptr_FieldGenerator[10])(pFVar8,printer);
          }
          else {
            FieldName_abi_cxx11_
                      ((string *)local_a0,
                       (cpp *)(this->optimized_order_).
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[(int)local_a4],pFVar18);
            FieldName_abi_cxx11_
                      (&local_60,
                       (cpp *)(this->optimized_order_).
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[(int)uVar5],field_00);
            io::Printer::Print(printer,
                               "::memset(&$first$_, 0, reinterpret_cast<char*>(&$last$_) -\n  reinterpret_cast<char*>(&$first$_) + sizeof($last$_));\n"
                               ,"first",(string *)local_a0,"last",&local_60);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
              operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
            }
          }
          pFVar18 = (FieldDescriptor *)(ulong)(uVar5 + 1);
        }
        iVar24 = (int)pFVar18;
        if (iVar24 <= (int)uVar15) {
          lVar21 = (long)iVar24;
          iVar24 = (uVar15 - iVar24) + 1;
          do {
            this_00 = (this->optimized_order_).
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar21];
            FieldName_abi_cxx11_((string *)local_a0,(cpp *)this_00,pFVar18);
            pFVar8 = FieldGeneratorMap::get(local_40,this_00);
            TVar6 = FieldDescriptor::type(this_00);
            if (((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar6 * 4) == 10) ||
                (TVar6 = FieldDescriptor::type(this_00),
                *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar6 * 4) == 9)) &&
               (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3)) {
              io::Printer::Print(printer,"if (has_$name$()) {\n","name",(string *)local_a0);
              bVar1 = true;
              io::Printer::Indent(printer);
            }
            else {
              bVar1 = false;
            }
            (*pFVar8->_vptr_FieldGenerator[10])(pFVar8,printer);
            pFVar18 = extraout_RDX;
            if (bVar1) {
              io::Printer::Outdent(printer);
              io::Printer::Print(printer,"}\n");
              pFVar18 = extraout_RDX_00;
            }
            if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
              operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
              pFVar18 = extraout_RDX_01;
            }
            lVar21 = lVar21 + 1;
            iVar24 = iVar24 + -1;
          } while (iVar24 != 0);
        }
        uVar16 = local_64;
        if (local_c0 != uVar15 && bVar4) {
          io::Printer::Outdent(printer);
          io::Printer::Print(printer,"}\n");
          uVar16 = local_64;
        }
      }
      ppFVar10 = (this->optimized_order_).
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar13 = (this->optimized_order_).
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      uVar5 = local_34;
    } while ((ulong)(long)(int)uVar16 < (ulong)((long)ppFVar13 - (long)ppFVar10 >> 3));
  }
  pDVar11 = this->descriptor_;
  if (0 < *(int *)(pDVar11 + 0x38)) {
    lVar21 = 0;
    lVar23 = 0;
    do {
      io::Printer::Print(printer,"clear_$oneof_name$();\n","oneof_name",
                         *(string **)(*(long *)(pDVar11 + 0x40) + lVar21));
      lVar23 = lVar23 + 1;
      pDVar11 = this->descriptor_;
      lVar21 = lVar21 + 0x30;
    } while (lVar23 < *(int *)(pDVar11 + 0x38));
  }
  if (this->num_weak_fields_ != 0) {
    io::Printer::Print(printer,"_weak_field_map_.ClearAll();\n");
    pDVar11 = this->descriptor_;
  }
  if ((*(int *)(*(long *)(pDVar11 + 0x10) + 0x8c) != 3) &&
     (io::Printer::Print(printer,"_has_bits_.Clear();\n"),
     *(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3)) {
    io::Printer::Print(printer,"_internal_metadata_.Clear();\n");
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateClear(io::Printer* printer) {
  printer->Print(
      "void $classname$::Clear() {\n"
      "// @@protoc_insertion_point(message_clear_start:$full_name$)\n",
      "classname", classname_, "full_name", descriptor_->full_name());
  printer->Indent();

  // Step 1: Extensions
  if (descriptor_->extension_range_count() > 0) {
    printer->Print("_extensions_.Clear();\n");
  }

  int last_i = -1;
  for (int i = 0; i < optimized_order_.size(); ) {
    // Detect infinite loops.
    GOOGLE_CHECK_NE(i, last_i);
    last_i = i;

    // Step 2: Repeated fields don't use _has_bits_; emit code to clear them
    // here.
    for (; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      const FieldGenerator& generator = field_generators_.get(field);

      if (!field->is_repeated()) {
        break;
      }

      if (use_dependent_base_ && IsFieldDependent(field)) {
        printer->Print("clear_$name$();\n", "name", FieldName(field));
      } else {
        generator.GenerateMessageClearingCode(printer);
      }
    }

    // Step 3: Greedily seek runs of fields that can be cleared by
    // memset-to-0.
    int last_chunk = -1;
    int last_chunk_start = -1;
    int last_chunk_end = -1;
    uint32 last_chunk_mask = 0;

    int memset_run_start = -1;
    int memset_run_end = -1;
    for (; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];

      if (!CanInitializeByZeroing(field)) {
        break;
      }

      // "index" defines where in the _has_bits_ the field appears.
      // "i" is our loop counter within optimized_order_.
      int index = HasFieldPresence(descriptor_->file()) ?
          has_bit_indices_[field->index()] : 0;
      int chunk = index / 8;

      if (last_chunk == -1) {
        last_chunk = chunk;
        last_chunk_start = i;
      } else if (chunk != last_chunk) {
        // Emit the fields for this chunk so far.
        break;
      }

      if (memset_run_start == -1) {
        memset_run_start = i;
      }

      memset_run_end = i;
      last_chunk_end = i;
      last_chunk_mask |= static_cast<uint32>(1) << (index % 32);
    }

    // Step 4: Non-repeated, non-zero initializable fields.
    for (; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (field->is_repeated() || CanInitializeByZeroing(field)) {
        break;
      }

      // "index" defines where in the _has_bits_ the field appears.
      // "i" is our loop counter within optimized_order_.
      int index = HasFieldPresence(descriptor_->file()) ?
          has_bit_indices_[field->index()] : 0;
      int chunk = index / 8;

      if (last_chunk == -1) {
        last_chunk = chunk;
        last_chunk_start = i;
      } else if (chunk != last_chunk) {
        // Emit the fields for this chunk so far.
        break;
      }

      last_chunk_end = i;
      last_chunk_mask |= static_cast<uint32>(1) << (index % 32);
    }

    if (last_chunk != -1) {
      GOOGLE_DCHECK_NE(-1, last_chunk_start);
      GOOGLE_DCHECK_NE(-1, last_chunk_end);
      GOOGLE_DCHECK_NE(0, last_chunk_mask);

      const int count = popcnt(last_chunk_mask);
      const bool have_outer_if = HasFieldPresence(descriptor_->file()) &&
          (last_chunk_start != last_chunk_end);

      if (have_outer_if) {
        // Check (up to) 8 has_bits at a time if we have more than one field in
        // this chunk.  Due to field layout ordering, we may check
        // _has_bits_[last_chunk * 8 / 32] multiple times.
        GOOGLE_DCHECK_LE(2, count);
        GOOGLE_DCHECK_GE(8, count);

        printer->Print(
          "if (_has_bits_[$index$ / 32] & $mask$u) {\n",
          "index", SimpleItoa(last_chunk * 8),
          "mask", SimpleItoa(last_chunk_mask));
        printer->Indent();
      }

      if (memset_run_start != -1) {
        if (memset_run_start == memset_run_end) {
          // For clarity, do not memset a single field.
          const FieldGenerator& generator =
              field_generators_.get(optimized_order_[memset_run_start]);
          generator.GenerateMessageClearingCode(printer);
        } else {
          const string first_field_name =
              FieldName(optimized_order_[memset_run_start]);
          const string last_field_name =
              FieldName(optimized_order_[memset_run_end]);

          printer->Print(
            "::memset(&$first$_, 0, reinterpret_cast<char*>(&$last$_) -\n"
            "  reinterpret_cast<char*>(&$first$_) + sizeof($last$_));\n",
            "first", first_field_name,
            "last", last_field_name);
        }

        // Advance last_chunk_start to skip over the fields we zeroed/memset.
        last_chunk_start = memset_run_end + 1;
      }

      // Go back and emit clears for each of the fields we processed.
      for (int j = last_chunk_start; j <= last_chunk_end; j++) {
        const FieldDescriptor* field = optimized_order_[j];
        const string fieldname = FieldName(field);
        const FieldGenerator& generator = field_generators_.get(field);

        // It's faster to just overwrite primitive types, but we should only
        // clear strings and messages if they were set.
        //
        // TODO(kenton):  Let the CppFieldGenerator decide this somehow.
        bool should_check_bit =
          field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
          field->cpp_type() == FieldDescriptor::CPPTYPE_STRING;

        bool have_enclosing_if = false;
        if (should_check_bit &&
            // If no field presence, then always clear strings/messages as well.
            HasFieldPresence(descriptor_->file())) {
          printer->Print("if (has_$name$()) {\n", "name", fieldname);
          printer->Indent();
          have_enclosing_if = true;
        }

        generator.GenerateMessageClearingCode(printer);

        if (have_enclosing_if) {
          printer->Outdent();
          printer->Print("}\n");
        }
      }

      if (have_outer_if) {
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  // Step 4: Unions.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print(
        "clear_$oneof_name$();\n",
        "oneof_name", descriptor_->oneof_decl(i)->name());
  }

  if (num_weak_fields_) {
    printer->Print("_weak_field_map_.ClearAll();\n");
  }

  if (HasFieldPresence(descriptor_->file())) {
    // Step 5: Everything else.
    printer->Print("_has_bits_.Clear();\n");
  }

  if (PreserveUnknownFields(descriptor_)) {
    printer->Print("_internal_metadata_.Clear();\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}